

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGElemPush(xmlRelaxNGValidCtxtPtr ctxt,xmlRegExecCtxtPtr exec)

{
  int iVar1;
  xmlRegExecCtxtPtr *ppxVar2;
  xmlRegExecCtxtPtr exec_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  if (ctxt->elemTab == (xmlRegExecCtxtPtr *)0x0) {
    ctxt->elemMax = 10;
    ppxVar2 = (xmlRegExecCtxtPtr *)(*xmlMalloc)((long)ctxt->elemMax << 3);
    ctxt->elemTab = ppxVar2;
    if (ctxt->elemTab == (xmlRegExecCtxtPtr *)0x0) {
      xmlRngVErrMemory(ctxt);
      return -1;
    }
  }
  if (ctxt->elemMax <= ctxt->elemNr) {
    ctxt->elemMax = ctxt->elemMax << 1;
    ppxVar2 = (xmlRegExecCtxtPtr *)(*xmlRealloc)(ctxt->elemTab,(long)ctxt->elemMax << 3);
    ctxt->elemTab = ppxVar2;
    if (ctxt->elemTab == (xmlRegExecCtxtPtr *)0x0) {
      xmlRngVErrMemory(ctxt);
      return -1;
    }
  }
  iVar1 = ctxt->elemNr;
  ctxt->elemNr = iVar1 + 1;
  ctxt->elemTab[iVar1] = exec;
  ctxt->elem = exec;
  return 0;
}

Assistant:

static int
xmlRelaxNGElemPush(xmlRelaxNGValidCtxtPtr ctxt, xmlRegExecCtxtPtr exec)
{
    if (ctxt->elemTab == NULL) {
        ctxt->elemMax = 10;
        ctxt->elemTab = (xmlRegExecCtxtPtr *) xmlMalloc(ctxt->elemMax *
                                                        sizeof
                                                        (xmlRegExecCtxtPtr));
        if (ctxt->elemTab == NULL) {
            xmlRngVErrMemory(ctxt);
            return (-1);
        }
    }
    if (ctxt->elemNr >= ctxt->elemMax) {
        ctxt->elemMax *= 2;
        ctxt->elemTab = (xmlRegExecCtxtPtr *) xmlRealloc(ctxt->elemTab,
                                                         ctxt->elemMax *
                                                         sizeof
                                                         (xmlRegExecCtxtPtr));
        if (ctxt->elemTab == NULL) {
            xmlRngVErrMemory(ctxt);
            return (-1);
        }
    }
    ctxt->elemTab[ctxt->elemNr++] = exec;
    ctxt->elem = exec;
    return (0);
}